

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.hpp
# Opt level: O0

void diy::Serialization<std::vector<diy::BlockID,_std::allocator<diy::BlockID>_>_>::save
               (BinaryBuffer *bb,Vector *v)

{
  size_type sVar1;
  const_reference bb_00;
  vector<diy::BlockID,_std::allocator<diy::BlockID>_> *in_RSI;
  BlockID *in_RDI;
  size_t s;
  unsigned_long *in_stack_ffffffffffffffd8;
  BinaryBuffer *in_stack_ffffffffffffffe0;
  
  sVar1 = Catch::clara::std::vector<diy::BlockID,_std::allocator<diy::BlockID>_>::size(in_RSI);
  save<unsigned_long>(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  if (sVar1 != 0) {
    bb_00 = Catch::clara::std::vector<diy::BlockID,_std::allocator<diy::BlockID>_>::operator[]
                      (in_RSI,0);
    Catch::clara::std::vector<diy::BlockID,_std::allocator<diy::BlockID>_>::size(in_RSI);
    save<diy::BlockID>((BinaryBuffer *)bb_00,in_RDI,0x1e275b);
  }
  return;
}

Assistant:

static void         save(BinaryBuffer& bb, const Vector& v)
    {
      size_t s = v.size();
      diy::save(bb, s);
      if (s > 0)
        diy::save(bb, &v[0], v.size());
    }